

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

xmlChar * xmlURIEscapeStr(xmlChar *str,xmlChar *list)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  int local_34;
  
  if (str != (xmlChar *)0x0) {
    if (*str == '\0') {
      pxVar3 = xmlStrdup(str);
      return pxVar3;
    }
    iVar2 = xmlStrlen(str);
    if (0 < iVar2) {
      pxVar3 = (xmlChar *)(*xmlMallocAtomic)((size_t)(iVar2 + 0x14));
      if (pxVar3 != (xmlChar *)0x0) {
        iVar6 = 0;
        local_34 = iVar2 + 0x14;
        do {
          bVar7 = *str;
          if (bVar7 == 0) {
            pxVar3[iVar6] = '\0';
            return pxVar3;
          }
          pxVar4 = pxVar3;
          if (local_34 - iVar6 < 4) {
            pxVar4 = xmlSaveUriRealloc(pxVar3,&local_34);
            if (pxVar4 == (xmlChar *)0x0) {
              xmlURIErrMemory("escaping URI value\n");
              (*xmlFree)(pxVar3);
              return (xmlChar *)0x0;
            }
            bVar7 = *str;
          }
          if (((((byte)(bVar7 - 0x30) < 10) || ((byte)(bVar7 - 0x40) < 0x1b)) ||
              ((byte)(bVar7 + 0x9f) < 0x1a)) ||
             (((bVar7 - 0x21 < 0x3f &&
               ((0x40000000000033c1U >> ((ulong)(bVar7 - 0x21) & 0x3f) & 1) != 0)) ||
              (bVar7 == 0x7e)))) {
LAB_0018bdf2:
            pxVar4[iVar6] = bVar7;
            iVar6 = iVar6 + 1;
          }
          else {
            pxVar3 = xmlStrchr(list,bVar7);
            if (pxVar3 != (xmlChar *)0x0) {
              bVar7 = *str;
              goto LAB_0018bdf2;
            }
            bVar5 = (bVar7 >> 4) + 0x37;
            if (bVar7 < 0xa0) {
              bVar5 = bVar7 >> 4 | 0x30;
            }
            pxVar4[iVar6] = '%';
            pxVar4[(long)iVar6 + 1] = bVar5;
            bVar7 = bVar7 & 0xf;
            xVar1 = bVar7 + 0x37;
            if (bVar7 < 10) {
              xVar1 = bVar7 + 0x30;
            }
            pxVar4[(long)iVar6 + 2] = xVar1;
            iVar6 = iVar6 + 3;
          }
          str = str + 1;
          pxVar3 = pxVar4;
        } while( true );
      }
      xmlURIErrMemory("escaping URI value\n");
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlURIEscapeStr(const xmlChar *str, const xmlChar *list) {
    xmlChar *ret, ch;
    xmlChar *temp;
    const xmlChar *in;
    int len, out;

    if (str == NULL)
	return(NULL);
    if (str[0] == 0)
	return(xmlStrdup(str));
    len = xmlStrlen(str);
    if (!(len > 0)) return(NULL);

    len += 20;
    ret = (xmlChar *) xmlMallocAtomic(len);
    if (ret == NULL) {
        xmlURIErrMemory("escaping URI value\n");
	return(NULL);
    }
    in = (const xmlChar *) str;
    out = 0;
    while(*in != 0) {
	if (len - out <= 3) {
            temp = xmlSaveUriRealloc(ret, &len);
	    if (temp == NULL) {
                xmlURIErrMemory("escaping URI value\n");
		xmlFree(ret);
		return(NULL);
	    }
	    ret = temp;
	}

	ch = *in;

	if ((ch != '@') && (!IS_UNRESERVED(ch)) && (!xmlStrchr(list, ch))) {
	    unsigned char val;
	    ret[out++] = '%';
	    val = ch >> 4;
	    if (val <= 9)
		ret[out++] = '0' + val;
	    else
		ret[out++] = 'A' + val - 0xA;
	    val = ch & 0xF;
	    if (val <= 9)
		ret[out++] = '0' + val;
	    else
		ret[out++] = 'A' + val - 0xA;
	    in++;
	} else {
	    ret[out++] = *in++;
	}

    }
    ret[out] = 0;
    return(ret);
}